

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

uint256 * ComputeTaprootMerkleRoot(Span<const_unsigned_char> control,uint256 *tapleaf_hash)

{
  long lVar1;
  size_t sVar2;
  int iVar3;
  undefined8 *in_RCX;
  Span<const_unsigned_char> *in_RDI;
  long in_FS_OFFSET;
  Span<const_unsigned_char> b;
  int i;
  int path_len;
  Span<const_unsigned_char> node;
  Span<const_unsigned_char> *other;
  int iVar4;
  Span<const_unsigned_char> *in_stack_ffffffffffffff88;
  Span<const_unsigned_char> in_stack_ffffffffffffff98;
  Span<const_unsigned_char> *local_48;
  uchar *local_28;
  size_t local_20;
  uchar *local_18;
  size_t local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  other = in_RDI;
  sVar2 = Span<const_unsigned_char>::size(in_RDI);
  if (sVar2 < 0x21) {
    __assert_fail("control.size() >= TAPROOT_CONTROL_BASE_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                  ,0x736,
                  "uint256 ComputeTaprootMerkleRoot(Span<const unsigned char>, const uint256 &)");
  }
  sVar2 = Span<const_unsigned_char>::size(in_RDI);
  if (0x1021 < sVar2) {
    __assert_fail("control.size() <= TAPROOT_CONTROL_MAX_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                  ,0x737,
                  "uint256 ComputeTaprootMerkleRoot(Span<const unsigned char>, const uint256 &)");
  }
  sVar2 = Span<const_unsigned_char>::size(in_RDI);
  if ((sVar2 - 0x21 & 0x1f) != 0) {
    __assert_fail("(control.size() - TAPROOT_CONTROL_BASE_SIZE) % TAPROOT_CONTROL_NODE_SIZE == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                  ,0x738,
                  "uint256 ComputeTaprootMerkleRoot(Span<const unsigned char>, const uint256 &)");
  }
  sVar2 = Span<const_unsigned_char>::size(in_RDI);
  iVar3 = (int)(sVar2 - 0x21 >> 5);
  in_RDI->m_data = (uchar *)*in_RCX;
  in_RDI->m_size = in_RCX[1];
  in_RDI[1].m_data = (uchar *)in_RCX[2];
  in_RDI[1].m_size = in_RCX[3];
  for (iVar4 = 0; iVar4 < iVar3; iVar4 = iVar4 + 1) {
    b = Span<const_unsigned_char>::subspan
                  (in_stack_ffffffffffffff88,(size_t)in_RCX,CONCAT44(iVar3,iVar4));
    Span<const_unsigned_char>::Span<uint256>
              ((Span<const_unsigned_char> *)CONCAT44(iVar3,iVar4),(uint256 *)other,in_RDI);
    local_48 = (Span<const_unsigned_char> *)b.m_data;
    ComputeTapbranchHash(in_stack_ffffffffffffff98,b);
    in_RDI->m_data = local_28;
    in_RDI->m_size = local_20;
    in_RDI[1].m_data = local_18;
    in_RDI[1].m_size = local_10;
    in_stack_ffffffffffffff88 = local_48;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (uint256 *)other;
  }
  __stack_chk_fail();
}

Assistant:

uint256 ComputeTaprootMerkleRoot(Span<const unsigned char> control, const uint256& tapleaf_hash)
{
    assert(control.size() >= TAPROOT_CONTROL_BASE_SIZE);
    assert(control.size() <= TAPROOT_CONTROL_MAX_SIZE);
    assert((control.size() - TAPROOT_CONTROL_BASE_SIZE) % TAPROOT_CONTROL_NODE_SIZE == 0);

    const int path_len = (control.size() - TAPROOT_CONTROL_BASE_SIZE) / TAPROOT_CONTROL_NODE_SIZE;
    uint256 k = tapleaf_hash;
    for (int i = 0; i < path_len; ++i) {
        Span node{Span{control}.subspan(TAPROOT_CONTROL_BASE_SIZE + TAPROOT_CONTROL_NODE_SIZE * i, TAPROOT_CONTROL_NODE_SIZE)};
        k = ComputeTapbranchHash(k, node);
    }
    return k;
}